

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void mg_call(mg_connection *nc,mg_event_handler_t ev_handler,int ev,void *ev_data)

{
  ulong uVar1;
  int num_bytes;
  char *buf;
  char *pcVar2;
  int ev_00;
  
  if ((ev_handler == (mg_event_handler_t)0x0) &&
     (ev_handler = nc->proto_handler, ev_handler == (mg_event_handler_t)0x0)) {
    ev_handler = nc->handler;
  }
  if (LL_DEBUG < s_cs_log_level) {
    fprintf(_stderr,"%-20s ","mg_call");
    pcVar2 = "proto";
    if (ev_handler == nc->handler) {
      pcVar2 = "user";
    }
    cs_log_printf("%p %s ev=%d ev_data=%p flags=%lu rmbl=%d smbl=%d",nc,pcVar2,(ulong)(uint)ev,
                  ev_data,nc->flags,(ulong)(uint)(nc->recv_mbuf).len,
                  (ulong)(uint)(nc->send_mbuf).len);
  }
  pcVar2 = nc->mgr->hexdump_file;
  if ((ev & 0xfffffffbU) != 0 && pcVar2 != (char *)0x0) {
    if (ev == 3) {
      buf = (nc->recv_mbuf).buf;
      num_bytes = *ev_data;
      ev_00 = 3;
    }
    else {
      buf = (char *)0x0;
      num_bytes = 0;
      ev_00 = ev;
    }
    mg_hexdump_connection(nc,pcVar2,buf,num_bytes,ev_00);
  }
  if (ev_handler != (mg_event_handler_t)0x0) {
    uVar1 = nc->flags;
    (*ev_handler)(nc,ev,ev_data);
    if ((ev_handler == nc->handler) && (nc->flags != uVar1)) {
      nc->flags = (ulong)((uint)nc->flags & 0x3f03c80) | uVar1 & 0xfffffffffc0fc37f;
    }
  }
  if (s_cs_log_level < LL_VERBOSE_DEBUG) {
    return;
  }
  fprintf(_stderr,"%-20s ","mg_call");
  pcVar2 = "proto";
  if (ev_handler == nc->handler) {
    pcVar2 = "user";
  }
  cs_log_printf("%p after %s flags=%lu rmbl=%d smbl=%d",nc,pcVar2,nc->flags,
                (ulong)(uint)(nc->recv_mbuf).len,(ulong)(uint)(nc->send_mbuf).len);
  return;
}

Assistant:

MG_INTERNAL void mg_call(struct mg_connection *nc,
                         mg_event_handler_t ev_handler, int ev, void *ev_data) {
    unsigned long flags_before;
    if (ev_handler == NULL) {
        /*
     * If protocol handler is specified, call it. Otherwise, call user-specified
     * event handler.
     */
        ev_handler = nc->proto_handler ? nc->proto_handler : nc->handler;
    }
    DBG(("%p %s ev=%d ev_data=%p flags=%lu rmbl=%d smbl=%d", nc,
            ev_handler == nc->handler ? "user" : "proto", ev, ev_data, nc->flags,
            (int) nc->recv_mbuf.len, (int) nc->send_mbuf.len));

#if !defined(NO_LIBC) && !defined(MG_DISABLE_HEXDUMP)
    /* LCOV_EXCL_START */
    if (nc->mgr->hexdump_file != NULL && ev != MG_EV_POLL &&
        ev != MG_EV_SEND /* handled separately */) {
        if (ev == MG_EV_RECV) {
            mg_hexdump_connection(nc, nc->mgr->hexdump_file, nc->recv_mbuf.buf,
                                  *(int *) ev_data, ev);
        } else {
            mg_hexdump_connection(nc, nc->mgr->hexdump_file, NULL, 0, ev);
        }
    }
/* LCOV_EXCL_STOP */
#endif
    if (ev_handler != NULL) {
        flags_before = nc->flags;
        ev_handler(nc, ev, ev_data);
        /* Prevent user handler from fiddling with system flags. */
        if (ev_handler == nc->handler && nc->flags != flags_before) {
            nc->flags = (flags_before & ~_MG_CALLBACK_MODIFIABLE_FLAGS_MASK) |
                        (nc->flags & _MG_CALLBACK_MODIFIABLE_FLAGS_MASK);
        }
    }
    DBG(("%p after %s flags=%lu rmbl=%d smbl=%d", nc,
            ev_handler == nc->handler ? "user" : "proto", nc->flags,
            (int) nc->recv_mbuf.len, (int) nc->send_mbuf.len));
}